

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O2

void __thiscall Liby::PollerEpoll::loop_once(PollerEpoll *this,Timestamp *param_1)

{
  epoll_event *__events;
  Channel *this_00;
  uint uVar1;
  Logger *pLVar2;
  ulong uVar3;
  long lVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_50;
  undefined8 local_40;
  undefined8 uStack_38;
  
  Poller::runNextLoopHandlers(&this->super_Poller);
  __events = (epoll_event *)
             (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar1 = epoll_wait(this->pollerfd_,__events,
                     (int)(((long)(this->events_).
                                  super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)__events) / 0xc)
                     ,-1);
  pLVar2 = Logger::getLogger();
  Logger::log(pLVar2,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = 0;
  }
  for (lVar4 = 0; uVar3 * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
    local_50._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerEpoll.cpp:25:33)>
               ::_M_invoke;
    local_78._8_8_ = 0;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerEpoll.cpp:25:33)>
               ::_M_manager;
    local_40 = 0;
    uStack_38 = 0;
    local_78._M_unused._M_object = this;
    local_50._M_unused._M_object = this;
    std::_Function_base::~_Function_base((_Function_base *)&local_50);
    this_00 = (this->super_Poller).channels_.
              super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
              super__Vector_impl_data._M_start
              [*(int *)((long)&((this->events_).
                                super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                                _M_impl.super__Vector_impl_data._M_start)->data + lVar4)];
    pLVar2 = Logger::getLogger();
    Logger::log(pLVar2,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    if (this_00 != (Channel *)0x0) {
      uVar1 = *(uint *)((long)&((this->events_).
                                super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                                _M_impl.super__Vector_impl_data._M_start)->events + lVar4);
      if ((uVar1 & 0x2008) == 0) {
        if ((uVar1 & 1) == 0) {
          if ((uVar1 & 4) != 0) {
            Channel::handleWritEvent(this_00);
          }
        }
        else {
          Channel::handleReadEvent(this_00);
        }
      }
      else {
        Channel::handleErroEvent(this_00);
      }
    }
    DeferCaller::~DeferCaller((DeferCaller *)&local_78);
  }
  Poller::runAfterLoopHandlers(&this->super_Poller);
  if ((ulong)(((long)(this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xc) < this->eventsSize_) {
    std::vector<epoll_event,_std::allocator<epoll_event>_>::resize
              (&this->events_,this->eventsSize_ * 2);
  }
  return;
}

Assistant:

void PollerEpoll::loop_once(Timestamp *) {
    runNextLoopHandlers();

    int nfds = ::epoll_wait(pollerfd_, &events_[0], events_.size(), -1);
    verbose("nfds = %d events_.size() = %u", nfds, events_.size());
    for (int i = 0; i < nfds; i++) {
        DeferCaller deferCaller([this] { runNextTickHandlers(); });

        int fd = events_[i].data.fd;
        Channel *ch = getChannel(fd);
        verbose("event in chan %p", ch);
        if (ch == NULL)
            continue;
        if (events_[i].events & (EPOLLRDHUP | EPOLLERR)) {
            ch->handleErroEvent();
        } else if (events_[i].events & EPOLLIN) {
            ch->handleReadEvent();
        } else if (events_[i].events & EPOLLOUT) {
            ch->handleWritEvent();
        }
    }

    runAfterLoopHandlers();

    // update channels
    //    for(int i = 0; i < nfds; i++) {
    //        int fd = events_[i].data.fd;
    //        Channel *ch = getChannel(fd);
    //        if(ch != nullptr && ch->isEventChanged()) {
    //            ch->changeEvent();
    //            info("update channel %p %d %d", ch, ch->readable(),
    //            ch->writable());
    //            updateChanel(ch, ch->readable(), ch->writable());
    //        }
    //    }
    if (eventsSize_ > events_.size()) {
        events_.resize(eventsSize_ * 2);
    }
}